

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_refs.cpp
# Opt level: O0

RK_S32 get_cpb_st_cfg_pos(EncVirtualCpb *cpb,MppEncRefCfgImpl *cfg)

{
  uint local_1c;
  RK_S32 st_cfg_cnt;
  RK_S32 st_cfg_pos;
  MppEncRefCfgImpl *cfg_local;
  EncVirtualCpb *cpb_local;
  
  local_1c = cpb->st_cfg_pos;
  if (cfg->st_cfg_cnt <= (int)local_1c) {
    local_1c = (uint)(1 < cfg->st_cfg_cnt);
  }
  return local_1c;
}

Assistant:

static RK_S32 get_cpb_st_cfg_pos(EncVirtualCpb *cpb, MppEncRefCfgImpl *cfg)
{
    RK_S32 st_cfg_pos = cpb->st_cfg_pos;
    RK_S32 st_cfg_cnt = cfg->st_cfg_cnt;

    /* NOTE: second loop will start from 1 */
    if (st_cfg_pos >= st_cfg_cnt)
        st_cfg_pos = (st_cfg_cnt > 1) ? (1) : (0);

    return st_cfg_pos;
}